

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

list<SectionInfo,_std::allocator<SectionInfo>_> * __thiscall
ArgsManager::GetUnrecognizedSections_abi_cxx11_
          (list<SectionInfo,_std::allocator<SectionInfo>_> *__return_storage_ptr__,ArgsManager *this
          )

{
  _List_node_base *p_Var1;
  int iVar2;
  const_iterator cVar3;
  _List_node_base *p_Var4;
  __off64_t *__offout;
  size_t __len;
  long lVar5;
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uint in_stack_ffffffffffffff08;
  allocator_type local_e9;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_
                               );
    if (iVar2 != 0) {
      ChainTypeToString_abi_cxx11_(&local_d8,REGTEST);
      ChainTypeToString_abi_cxx11_(&local_b8,SIGNET);
      ChainTypeToString_abi_cxx11_(&local_98,TESTNET);
      ChainTypeToString_abi_cxx11_(&local_78,TESTNET4);
      ChainTypeToString_abi_cxx11_(&local_58,MAIN);
      __l._M_len = 5;
      __l._M_array = &local_d8;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&criticalblock3,&local_e9);
      lVar5 = 0x80;
      do {
        std::__cxx11::string::~string((string *)((long)&local_d8._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      __cxa_atexit(std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~set,&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_);
    }
  }
  __offout = (__off64_t *)0xa7;
  __len = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock3,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/args.cpp"
             ,0xa7,false);
  std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::list
            (__return_storage_ptr__,&this->m_config_sections);
  local_d8.field_2._M_allocated_capacity = 0;
  p_Var1 = (__return_storage_ptr__->super__List_base<SectionInfo,_std::allocator<SectionInfo>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_d8._M_dataplus._M_p = (pointer)&local_d8;
  local_d8._M_string_length = (size_type)&local_d8;
  while (p_Var4 = p_Var1, p_Var4 != (_List_node_base *)__return_storage_ptr__) {
    p_Var1 = (((_List_base<SectionInfo,_std::allocator<SectionInfo>_> *)&p_Var4->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_._M_t,
                   (key_type *)(p_Var4 + 1));
    if ((_Rb_tree_header *)cVar3._M_node !=
        &GetUnrecognizedSections[abi:cxx11]()::available_sections_abi_cxx11_._M_t._M_impl.
         super__Rb_tree_header) {
      std::__cxx11::list<SectionInfo,_std::allocator<SectionInfo>_>::splice
                ((list<SectionInfo,_std::allocator<SectionInfo>_> *)&local_d8,
                 (int)local_d8._M_dataplus._M_p,(__off64_t *)__return_storage_ptr__,(int)p_Var4,
                 __offout,__len,in_stack_ffffffffffffff08);
    }
  }
  std::__cxx11::_List_base<SectionInfo,_std::allocator<SectionInfo>_>::_M_clear
            ((_List_base<SectionInfo,_std::allocator<SectionInfo>_> *)&local_d8);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::list<SectionInfo> ArgsManager::GetUnrecognizedSections() const
{
    // Section names to be recognized in the config file.
    static const std::set<std::string> available_sections{
        ChainTypeToString(ChainType::REGTEST),
        ChainTypeToString(ChainType::SIGNET),
        ChainTypeToString(ChainType::TESTNET),
        ChainTypeToString(ChainType::TESTNET4),
        ChainTypeToString(ChainType::MAIN),
    };

    LOCK(cs_args);
    std::list<SectionInfo> unrecognized = m_config_sections;
    unrecognized.remove_if([](const SectionInfo& appeared){ return available_sections.find(appeared.m_name) != available_sections.end(); });
    return unrecognized;
}